

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,ReadThreadsGraph_const&,int,float,int,int,int>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul,5ul,6ul>
          (argument_loader<pybind11::detail::value_and_holder&,ReadThreadsGraph_const&,int,float,int,int,int>
           *this,long call)

{
  char *pcVar1;
  uint uVar2;
  undefined8 *puVar3;
  long lVar4;
  bool bVar5;
  char local_17 [7];
  
  puVar3 = *(undefined8 **)(call + 8);
  uVar2 = **(uint **)(call + 0x20);
  *(undefined8 *)(this + 0x30) = *puVar3;
  type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
            ((type_caster_generic *)(this + 0x18),(PyObject *)puVar3[1],SUB41((uVar2 & 2) >> 1,0));
  type_caster<int,_void>::load
            ((type_caster<int,_void> *)(this + 0x10),*(PyObject **)(*(long *)(call + 8) + 0x10),
             SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
  type_caster<float,_void>::load
            ((type_caster<float,_void> *)(this + 0xc),*(PyObject **)(*(long *)(call + 8) + 0x18),
             SUB41((**(uint **)(call + 0x20) & 8) >> 3,0));
  type_caster<int,_void>::load
            ((type_caster<int,_void> *)(this + 8),*(PyObject **)(*(long *)(call + 8) + 0x20),
             SUB41((**(uint **)(call + 0x20) & 0x10) >> 4,0));
  type_caster<int,_void>::load
            ((type_caster<int,_void> *)(this + 4),*(PyObject **)(*(long *)(call + 8) + 0x28),
             SUB41((**(uint **)(call + 0x20) & 0x20) >> 5,0));
  type_caster<int,_void>::load
            ((type_caster<int,_void> *)this,*(PyObject **)(*(long *)(call + 8) + 0x30),
             SUB41((**(uint **)(call + 0x20) & 0x40) >> 6,0));
  lVar4 = 1;
  do {
    bVar5 = lVar4 == 7;
    if (bVar5) {
      return bVar5;
    }
    pcVar1 = local_17 + lVar4;
    lVar4 = lVar4 + 1;
  } while (*pcVar1 != '\0');
  return bVar5;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }